

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_smartAlloc.cpp
# Opt level: O0

double ** __thiscall
PP_smartAlloc::allocateDouble(PP_smartAlloc *this,unsigned_long _Nt,unsigned_long _Nz)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  undefined8 local_40;
  unsigned_long i_1;
  unsigned_long i;
  unsigned_long I;
  double **_M;
  unsigned_long _Nz_local;
  unsigned_long _Nt_local;
  PP_smartAlloc *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _Nt;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  I = (unsigned_long)operator_new__(uVar3);
  if ((void *)I != (void *)0x0) {
    i = _Nt + 1;
    for (i_1 = 0; i_1 < _Nt; i_1 = i_1 + 1) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = _Nz;
      uVar3 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pvVar4 = operator_new__(uVar3);
      *(void **)(I + i_1 * 8) = pvVar4;
      if (*(long *)(I + i_1 * 8) == 0) {
        i = i_1;
        i_1 = _Nt;
      }
    }
    if (i != _Nt + 1) {
      for (local_40 = 0; local_40 < i; local_40 = local_40 + 1) {
        pvVar4 = *(void **)(I + local_40 * 8);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,8);
        }
      }
      if ((void *)I != (void *)0x0) {
        operator_delete((void *)I,8);
      }
      I = 0;
    }
  }
  return (double **)I;
}

Assistant:

double ** PP_smartAlloc::allocateDouble(unsigned long _Nt, unsigned long _Nz)
{
    double** _M = new double*[_Nt];
    if(_M!=NULL)
    {
        unsigned long I = _Nt+1;
        for(unsigned long i=0 ; i<_Nt ; i++)
        {
            _M[i] = new double[_Nz];
            if(_M[i]==NULL)
            {
                I=i;
                i=_Nt;
            }
        }
        if(I!=(_Nt+1))
        {
            for(unsigned long i=0 ; i<I ; i++)
            {
                delete _M[i];
            }
            delete _M;
            _M = NULL;
        }
    }
    return _M;
}